

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VehicleState.cpp
# Opt level: O1

int __thiscall
VehicleState::clone(VehicleState *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  undefined8 *puVar1;
  
  this->p = (Point *)0x0;
  puVar1 = (undefined8 *)operator_new(0x30);
  puVar1[1] = 0x100000001;
  *puVar1 = &PTR___Sp_counted_ptr_inplace_00120d30;
  *(undefined4 *)(puVar1 + 3) = 1000;
  puVar1[4] = 0;
  puVar1[5] = 0;
  *(undefined8 **)&this->current_cargo = puVar1;
  this->p = (Point *)(puVar1 + 2);
  puVar1[2] = *(undefined8 *)__fn;
  *(undefined4 *)(puVar1 + 3) = *(undefined4 *)(__fn + 8);
  puVar1[4] = *(undefined8 *)(__fn + 0x10);
  puVar1[5] = *(undefined8 *)(__fn + 0x18);
  return (int)this;
}

Assistant:

std::shared_ptr<VehicleState> VehicleState::clone()
const {
	auto vs = std::make_shared<VehicleState>();
	vs->p = this->p;
	
	vs->current_cargo = this->current_cargo;
	vs->current_time = this->current_time;
	vs->current_distance = this->current_distance;
	return vs;
}